

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O0

void __thiscall cmXMLWriter::~cmXMLWriter(cmXMLWriter *this)

{
  cmXMLWriter *this_local;
  
  if (this->Indent == 0) {
    std::__cxx11::string::~string((string *)&this->IndentationElement);
    std::
    stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~stack(&this->Elements);
    return;
  }
  __assert_fail("this->Indent == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmXMLWriter.cxx"
                ,0x15,"cmXMLWriter::~cmXMLWriter()");
}

Assistant:

cmXMLWriter::~cmXMLWriter()
{
  assert(this->Indent == 0);
}